

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int uv_pipe_open(uv_pipe_t *handle,uv_file fd)

{
  int iVar1;
  uv_stream_t *in_stack_ffffffffffffffe8;
  
  iVar1 = uv__stream_open(in_stack_ffffffffffffffe8,0,0x112350);
  return iVar1;
}

Assistant:

int uv_pipe_open(uv_pipe_t* handle, uv_file fd) {
#if defined(__APPLE__)
  int err;

  err = uv__stream_try_select((uv_stream_t*) handle, &fd);
  if (err)
    return err;
#endif /* defined(__APPLE__) */

  return uv__stream_open((uv_stream_t*)handle,
                         fd,
                         UV_STREAM_READABLE | UV_STREAM_WRITABLE);
}